

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwDefaultWindowHints(void)

{
  if (_glfwInitialized != '\0') {
    _glfw.hints.debug = 0;
    _glfw.hints.profile = 0;
    _glfw.hints.samples = 0;
    _glfw.hints.sRGB = 0;
    _glfw.hints.accumRedBits = 0;
    _glfw.hints.accumGreenBits = 0;
    _glfw.hints.accumBlueBits = 0;
    _glfw.hints.accumAlphaBits = 0;
    _glfw.hints.auxBuffers = 0;
    _glfw.hints.stereo = 0;
    _glfw.hints.robustness = 0;
    _glfw.hints.release = 0;
    _glfw.hints.api = 0x30001;
    _glfw.hints.major = 1;
    _glfw.hints.minor = 0;
    _glfw.hints.forward = 0;
    _glfw.hints.resizable = 1;
    _glfw.hints.visible = 1;
    _glfw.hints.decorated = 1;
    _glfw.hints.focused = 1;
    _glfw.hints.autoIconify = 1;
    _glfw.hints.floating = 0;
    _glfw.hints.refreshRate = -1;
    _glfw.hints.doublebuffer = 1;
    _glfw.hints.redBits = 8;
    _glfw.hints.greenBits = 8;
    _glfw.hints.blueBits = 8;
    _glfw.hints.alphaBits = 8;
    _glfw.hints.depthBits = 0x18;
    _glfw.hints.stencilBits = 8;
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

void glfwDefaultWindowHints(void)
{
    _GLFW_REQUIRE_INIT();

    memset(&_glfw.hints, 0, sizeof(_glfw.hints));

    // The default is OpenGL with minimum version 1.0
    _glfw.hints.api   = GLFW_OPENGL_API;
    _glfw.hints.major = 1;
    _glfw.hints.minor = 0;

    // The default is a focused, visible, resizable window with decorations
    _glfw.hints.resizable   = GL_TRUE;
    _glfw.hints.visible     = GL_TRUE;
    _glfw.hints.decorated   = GL_TRUE;
    _glfw.hints.focused     = GL_TRUE;
    _glfw.hints.autoIconify = GL_TRUE;

    // The default is to select the highest available refresh rate
    _glfw.hints.refreshRate = GLFW_DONT_CARE;

    // The default is 24 bits of color, 24 bits of depth and 8 bits of stencil,
    // double buffered
    _glfw.hints.redBits      = 8;
    _glfw.hints.greenBits    = 8;
    _glfw.hints.blueBits     = 8;
    _glfw.hints.alphaBits    = 8;
    _glfw.hints.depthBits    = 24;
    _glfw.hints.stencilBits  = 8;
    _glfw.hints.doublebuffer = GL_TRUE;
}